

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderHasAttributes(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->node == (xmlNodePtr)0x0) {
    return 0;
  }
  pxVar1 = reader->node;
  if (reader->curnode != (xmlNodePtr)0x0) {
    pxVar1 = reader->curnode;
  }
  if (pxVar1->type == XML_ELEMENT_NODE) {
    if (pxVar1->properties != (_xmlAttr *)0x0) {
      return 1;
    }
    if (pxVar1->nsDef != (xmlNs *)0x0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
xmlTextReaderHasAttributes(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    if ((node->type == XML_ELEMENT_NODE) &&
	((node->properties != NULL) || (node->nsDef != NULL)))
	return(1);
    /* TODO: handle the xmlDecl */
    return(0);
}